

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O0

int fits_rcomp_short(short *a,int nx,uchar *c,int clen,int nblock)

{
  short sVar1;
  uint uVar2;
  short sVar3;
  int iVar4;
  void *__ptr;
  byte bVar5;
  uint local_b4;
  uint *diff;
  double dpsum;
  double pixelsum;
  uint uStack_90;
  unsigned_short psum;
  int lbits_to_go;
  int lbitbuffer;
  int bbits;
  int fsbits;
  int fsmax;
  int top;
  int fsmask;
  int fs;
  int v;
  short pdiff;
  int nextpix;
  int lastpix;
  int thisblock;
  int j;
  int i;
  Buffer *buffer;
  Buffer bufmem;
  int nblock_local;
  int clen_local;
  uchar *c_local;
  int nx_local;
  short *a_local;
  
  bufmem.current = c + clen;
  buffer._4_4_ = 8;
  bufmem.end._0_4_ = nblock;
  bufmem.end._4_4_ = clen;
  bufmem._0_8_ = c;
  bufmem.start = c;
  __ptr = malloc((long)nblock << 2);
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
    a_local._4_4_ = -1;
  }
  else {
    start_outputing_bits((Buffer *)&buffer);
    iVar4 = output_nbits((Buffer *)&buffer,(int)*a,0x10);
    if (iVar4 == -1) {
      ffpmsg("rice_encode: end of buffer");
      free(__ptr);
      a_local._4_4_ = -1;
    }
    else {
      sVar3 = *a;
      nextpix = (int)bufmem.end;
      for (thisblock = 0; thisblock < nx; thisblock = (int)bufmem.end + thisblock) {
        if (nx - thisblock < (int)bufmem.end) {
          nextpix = nx - thisblock;
        }
        dpsum = 0.0;
        for (lastpix = 0; lastpix < nextpix; lastpix = lastpix + 1) {
          sVar1 = a[thisblock + lastpix];
          sVar3 = sVar1 - sVar3;
          if (sVar3 < 0) {
            local_b4 = (int)sVar3 << 1 ^ 0xffffffff;
          }
          else {
            local_b4 = (int)sVar3 << 1;
          }
          *(uint *)((long)__ptr + (long)lastpix * 4) = local_b4;
          dpsum = (double)*(uint *)((long)__ptr + (long)lastpix * 4) + dpsum;
          sVar3 = sVar1;
        }
        diff = (uint *)(((dpsum - (double)(nextpix / 2)) - 1.0) / (double)nextpix);
        if ((double)diff < 0.0) {
          diff = (uint *)0x0;
        }
        top = 0;
        for (pixelsum._2_2_ = (ushort)((int)((int)(double)diff & 0xffffU) >> 1); pixelsum._2_2_ != 0
            ; pixelsum._2_2_ = (ushort)((int)(uint)pixelsum._2_2_ >> 1)) {
          top = top + 1;
        }
        if (top < 0xe) {
          if (((top != 0) || (dpsum != 0.0)) || (NAN(dpsum))) {
            iVar4 = output_nbits((Buffer *)&buffer,top + 1,4);
            if (iVar4 == -1) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              return -1;
            }
            bVar5 = (byte)top;
            uStack_90 = (uint)buffer;
            pixelsum._4_4_ = buffer._4_4_;
            for (lastpix = 0; lastpix < nextpix; lastpix = lastpix + 1) {
              uVar2 = *(uint *)((long)__ptr + (long)lastpix * 4);
              iVar4 = (int)uVar2 >> (bVar5 & 0x1f);
              if (pixelsum._4_4_ < iVar4 + 1) {
                *bufmem.start = (Buffer_t)(uStack_90 << ((byte)pixelsum._4_4_ & 0x1f));
                for (fsbits = iVar4 - pixelsum._4_4_; bufmem.start = bufmem.start + 1, 7 < fsbits;
                    fsbits = fsbits + -8) {
                  *bufmem.start = '\0';
                }
                uStack_90 = 1;
                pixelsum._4_4_ = 7 - fsbits;
              }
              else {
                uStack_90 = uStack_90 << ((char)iVar4 + 1U & 0x1f) | 1;
                pixelsum._4_4_ = pixelsum._4_4_ - (iVar4 + 1);
              }
              if (0 < top) {
                uStack_90 = uVar2 & (1 << (bVar5 & 0x1f)) - 1U | uStack_90 << (bVar5 & 0x1f);
                for (pixelsum._4_4_ = pixelsum._4_4_ - top; pixelsum._4_4_ < 1;
                    pixelsum._4_4_ = pixelsum._4_4_ + 8) {
                  *bufmem.start = (Buffer_t)((int)uStack_90 >> (-(char)pixelsum._4_4_ & 0x1fU));
                  bufmem.start = bufmem.start + 1;
                }
              }
            }
            if (bufmem.current < bufmem.start) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              return -1;
            }
            buffer._0_4_ = uStack_90;
            buffer._4_4_ = pixelsum._4_4_;
          }
          else {
            iVar4 = output_nbits((Buffer *)&buffer,0,4);
            if (iVar4 == -1) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              return -1;
            }
          }
        }
        else {
          iVar4 = output_nbits((Buffer *)&buffer,0xf,4);
          if (iVar4 == -1) {
            ffpmsg("rice_encode: end of buffer");
            free(__ptr);
            return -1;
          }
          for (lastpix = 0; lastpix < nextpix; lastpix = lastpix + 1) {
            iVar4 = output_nbits((Buffer *)&buffer,*(int *)((long)__ptr + (long)lastpix * 4),0x10);
            if (iVar4 == -1) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              return -1;
            }
          }
        }
      }
      done_outputing_bits((Buffer *)&buffer);
      free(__ptr);
      a_local._4_4_ = (int)bufmem.start - bufmem.bitbuffer;
    }
  }
  return a_local._4_4_;
}

Assistant:

int fits_rcomp_short(
	  short a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize;  */
int i, j, thisblock;

/* 
NOTE: in principle, the following 2 variable could be declared as 'short'
but in fact the code runs faster (on 32-bit Linux at least) as 'int'
*/
int lastpix, nextpix;
/* int pdiff; */
short pdiff; 
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
/* unsigned int psum; */
unsigned short psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 2; */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move these out of switch block to further tweak performance */
    fsbits = 4;
    fsmax = 14;
    
    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first short value to the first 2 bytes of the buffer */
    if (output_nbits(buffer, a[0], 16) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}
	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
/*	psum = ((unsigned int) dpsum ) >> 1; */
	psum = ((unsigned short) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
/* case3++; */
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
/* case1++; */
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
/* case2++; */
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);
		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }
	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}